

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_digest.cpp
# Opt level: O3

void __thiscall argparse::args_t::args_t(args_t *this,int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  FILE *pFVar3;
  int iVar4;
  undefined4 in_register_00000034;
  char *str;
  char *__filename;
  char *__s1;
  
  this->input = _stdin;
  this->output = (FILE *)_stdout;
  this->motif_list = (char *)0x0;
  this->rc = complement;
  this->match = exact;
  if (1 < argc) {
    iVar4 = 1;
    __filename = (char *)CONCAT44(in_register_00000034,argc);
    __s1 = (char *)this;
    do {
      str = argv[iVar4];
      if (*str == '-') {
        bVar1 = str[1];
        if (bVar1 < 0x6d) {
          if (bVar1 != 0x65) {
            if (bVar1 == 0x2d) {
              __s1 = str + 2;
              __filename = "help";
              iVar2 = strcmp(__s1,"help");
              if (iVar2 == 0) goto LAB_0010655f;
            }
            else if ((bVar1 == 0x68) && (str[2] == '\0')) {
              argparse::args_t();
LAB_0010655f:
              argparse::args_t();
              pFVar3 = _stdout;
              if ((__filename != (char *)0x0) && ((*__filename != '-' || (__filename[1] != '\0'))))
              {
                pFVar3 = fopen(__filename,"wb");
              }
              ((args_t *)__s1)->output = (FILE *)pFVar3;
              if (pFVar3 == (FILE *)0x0) {
                ERROR("failed to open the OUTPUT file %s",__filename);
                return;
              }
              return;
            }
            goto LAB_001064c3;
          }
          iVar4 = iVar4 + 1;
          if (iVar4 == argc) {
            ERROR("ran out of command line arguments");
          }
          str = argv[iVar4];
          __s1 = (char *)this;
          parse_motif(this,str);
        }
        else if (bVar1 == 0x6d) {
          iVar4 = iVar4 + 1;
          if (iVar4 == argc) {
            ERROR("ran out of command line arguments");
          }
          str = argv[iVar4];
          __s1 = (char *)this;
          parse_match_mode(this,str);
        }
        else if (bVar1 == 0x6f) {
          iVar4 = iVar4 + 1;
          if (iVar4 == argc) {
            ERROR("ran out of command line arguments");
          }
          str = argv[iVar4];
          __s1 = (char *)this;
          parse_output(this,str);
        }
        else {
          if (bVar1 != 0x72) goto LAB_001064c3;
          iVar4 = iVar4 + 1;
          if (iVar4 == argc) {
            ERROR("ran out of command line arguments");
          }
          str = argv[iVar4];
          __s1 = (char *)this;
          parse_rc_option(this,str);
        }
      }
      else if (iVar4 == argc + -1) {
        __s1 = (char *)this;
        parse_input(this,str);
        iVar4 = argc + -1;
      }
      else {
LAB_001064c3:
        __s1 = "unknown argument: %s";
        ERROR("unknown argument: %s");
      }
      iVar4 = iVar4 + 1;
      __filename = str;
    } while (iVar4 < argc);
    if (this->motif_list != (char *)0x0) {
      return;
    }
  }
  ERROR("Required argument MOTIF_LIST was not provided");
  return;
}

Assistant:

args_t::args_t( int argc, const char * argv[] ) :
    input( stdin ),
    output( stdout ),
    rc ( DEFAULT_RC ),
    match (DEFAULT_MATCH),
    motif_list (NULL)
    {
        // skip arg[0], it's just the program name
        for (int i = 1; i < argc; ++i ) {
            const char * arg = argv[i];
            
            if ( arg[0] == '-' && arg[1] == '-' ) {
                if ( !strcmp( &arg[2], "help" ) ) help();
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else if ( arg[0] == '-' ) {
                if ( !strcmp( &arg[1], "h" ) ) help();
                else if (  arg[1] == 'o' ) parse_output( next_arg (i, argc, argv) );
                else if (  arg[1] == 'r')  parse_rc_option ( next_arg (i, argc, argv) );
                else if (  arg[1] == 'm')  parse_match_mode( next_arg (i, argc, argv) );
                else if (  arg[1] == 'e')  parse_motif( next_arg (i, argc, argv) );
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else
                if (i == argc-1) {
                    parse_input (arg);
                } else {
                    ERROR( "unknown argument: %s", arg );
                }
        }
                
        if (motif_list == NULL) {
            ERROR ("Required argument MOTIF_LIST was not provided");
        }
    }